

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synonyms_avx2.h
# Opt level: O0

__m256i * yy_loadu_4x64(void *e3,void *e2,void *e1,void *e0)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m256i *palVar3;
  ulong *in_RCX;
  ulong *in_RDX;
  ulong *in_RSI;
  __m256i *in_RDI;
  longlong in_R8;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i lo;
  __m128i hi;
  __m128d v23;
  __m128d v2;
  __m128d v01;
  __m128d v0;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *in_RCX;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *in_RDX;
  vunpcklpd_avx(auVar2,auVar4);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *in_RSI;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (*in_RDI)[0];
  vunpcklpd_avx(auVar1,auVar5);
  lo[1] = in_R8;
  lo[0] = (longlong)in_RCX;
  hi[1] = (longlong)in_RDX;
  hi[0] = (longlong)in_RSI;
  palVar3 = yy_set_m128i(in_RDI,hi,lo);
  return palVar3;
}

Assistant:

static inline __m256i yy_loadu_4x64(const void *e3, const void *e2,
                                    const void *e1, const void *e0) {
  __m128d v0 = _mm_castsi128_pd(_mm_loadl_epi64((const __m128i *)e0));
  __m128d v01 = _mm_loadh_pd(v0, (const double *)e1);
  __m128d v2 = _mm_castsi128_pd(_mm_loadl_epi64((const __m128i *)e2));
  __m128d v23 = _mm_loadh_pd(v2, (const double *)e3);
  // Note this can be replaced with
  // `_mm256_castpd_si256(_mm256_set_m128d(v23, v01))` if immintrin.h contains
  // _mm256_set_m128d() with all supported compilers. This version is used to
  // match the behavior with yy_set_m128i().
  return yy_set_m128i(_mm_castpd_si128(v23), _mm_castpd_si128(v01));
}